

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::sbc_a_mhl(CPU *this)

{
  ushort uVar1;
  Registers *r1;
  int iVar2;
  
  r1 = this->regs;
  uVar1._0_1_ = r1->h;
  uVar1._1_1_ = r1->l;
  iVar2 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
  sbc_r8_r8(this,&r1->a,(uint8_t)iVar2);
  return 2;
}

Assistant:

int CPU::sbc_a_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    sbc_r8_r8(regs.a, mmu.read_byte(addr));
    return 2;
}